

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32_stage4_sse4_1
               (__m128i *bf1,__m128i *cospim8,__m128i *cospi56,__m128i *cospi8,__m128i *cospim56,
               __m128i *cospim40,__m128i *cospi24,__m128i *cospi40,__m128i *cospim24,
               __m128i *rounding,int bit)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  __m128i temp2;
  __m128i temp1;
  __m128i *in_stack_00000020;
  
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x110),in_RDX,(__m128i *)(in_RDI + 0x1e0),
                  in_stack_00000020,(int)cospim40);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x110),in_RCX,(__m128i *)(in_RDI + 0x1e0),
                  in_stack_00000020,(int)cospim40);
  *(undefined8 *)(in_RDI + 0x1e0) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0x1e8) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0x110) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x118) = extraout_XMM0_Qb;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x120),in_RSI,(__m128i *)(in_RDI + 0x1d0),
                  in_stack_00000020,(int)cospim40);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x120),in_RDX,(__m128i *)(in_RDI + 0x1d0),
                  in_stack_00000020,(int)cospim40);
  *(undefined8 *)(in_RDI + 0x1d0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 0x1d8) = extraout_XMM0_Qb_02;
  *(undefined8 *)(in_RDI + 0x120) = extraout_XMM0_Qa_01;
  *(undefined8 *)(in_RDI + 0x128) = extraout_XMM0_Qb_01;
  half_btf_sse4_1(in_R9,(__m128i *)(in_RDI + 0x150),(__m128i *)temp2[1],(__m128i *)(in_RDI + 0x1a0),
                  in_stack_00000020,(int)cospim40);
  half_btf_sse4_1((__m128i *)temp2[1],(__m128i *)(in_RDI + 0x150),(__m128i *)temp1[0],
                  (__m128i *)(in_RDI + 0x1a0),in_stack_00000020,(int)cospim40);
  *(undefined8 *)(in_RDI + 0x1a0) = extraout_XMM0_Qa_04;
  *(undefined8 *)(in_RDI + 0x1a8) = extraout_XMM0_Qb_04;
  *(undefined8 *)(in_RDI + 0x150) = extraout_XMM0_Qa_03;
  *(undefined8 *)(in_RDI + 0x158) = extraout_XMM0_Qb_03;
  half_btf_sse4_1((__m128i *)temp1[1],(__m128i *)(in_RDI + 0x160),in_R9,(__m128i *)(in_RDI + 400),
                  in_stack_00000020,(int)cospim40);
  half_btf_sse4_1(in_R9,(__m128i *)(in_RDI + 0x160),(__m128i *)temp2[1],(__m128i *)(in_RDI + 400),
                  in_stack_00000020,(int)cospim40);
  *(undefined8 *)(in_RDI + 400) = extraout_XMM0_Qa_06;
  *(undefined8 *)(in_RDI + 0x198) = extraout_XMM0_Qb_06;
  *(undefined8 *)(in_RDI + 0x160) = extraout_XMM0_Qa_05;
  *(undefined8 *)(in_RDI + 0x168) = extraout_XMM0_Qb_05;
  return;
}

Assistant:

static inline void idct32_stage4_sse4_1(
    __m128i *bf1, const __m128i *cospim8, const __m128i *cospi56,
    const __m128i *cospi8, const __m128i *cospim56, const __m128i *cospim40,
    const __m128i *cospi24, const __m128i *cospi40, const __m128i *cospim24,
    const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  temp1 = half_btf_sse4_1(cospim8, &bf1[17], cospi56, &bf1[30], rounding, bit);
  bf1[30] = half_btf_sse4_1(cospi56, &bf1[17], cospi8, &bf1[30], rounding, bit);
  bf1[17] = temp1;

  temp2 = half_btf_sse4_1(cospim56, &bf1[18], cospim8, &bf1[29], rounding, bit);
  bf1[29] =
      half_btf_sse4_1(cospim8, &bf1[18], cospi56, &bf1[29], rounding, bit);
  bf1[18] = temp2;

  temp1 = half_btf_sse4_1(cospim40, &bf1[21], cospi24, &bf1[26], rounding, bit);
  bf1[26] =
      half_btf_sse4_1(cospi24, &bf1[21], cospi40, &bf1[26], rounding, bit);
  bf1[21] = temp1;

  temp2 =
      half_btf_sse4_1(cospim24, &bf1[22], cospim40, &bf1[25], rounding, bit);
  bf1[25] =
      half_btf_sse4_1(cospim40, &bf1[22], cospi24, &bf1[25], rounding, bit);
  bf1[22] = temp2;
}